

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O1

void __thiscall
tchecker::syncprod::vloc_synchronized_edges_iterator_t::advance_while_empty_cartesian_product
          (vloc_synchronized_edges_iterator_t *this)

{
  pointer peVar1;
  pointer peVar2;
  pointer peVar3;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar4;
  pointer psVar5;
  loc_edges_maps_t *this_00;
  bool bVar6;
  synchronization_t *psVar7;
  sync_constraint_t *constr;
  pointer psVar8;
  __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
  __end2;
  bool bVar9;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  edges;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  local_40;
  
  (this->_cartesian_it)._nranges = 0;
  peVar1 = (this->_cartesian_it)._begins.
           super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_cartesian_it)._begins.
      super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
      ._M_impl.super__Vector_impl_data._M_finish != peVar1) {
    (this->_cartesian_it)._begins.
    super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
    ._M_impl.super__Vector_impl_data._M_finish = peVar1;
  }
  peVar2 = (this->_cartesian_it)._ends.
           super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_cartesian_it)._ends.
      super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
      ._M_impl.super__Vector_impl_data._M_finish != peVar2) {
    (this->_cartesian_it)._ends.
    super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
    ._M_impl.super__Vector_impl_data._M_finish = peVar2;
  }
  peVar3 = (this->_cartesian_it)._its.
           super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_cartesian_it)._its.
      super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
      ._M_impl.super__Vector_impl_data._M_finish != peVar3) {
    (this->_cartesian_it)._its.
    super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
    ._M_impl.super__Vector_impl_data._M_finish = peVar3;
  }
  if ((this->_cartesian_it)._begins.
      super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
      ._M_impl.super__Vector_impl_data._M_finish != peVar1) {
    __assert_fail("_nranges == _begins.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/iterator.hh"
                  ,0x1e8,
                  "void tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>>::clear() [R = tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>]"
                 );
  }
  if ((this->_cartesian_it)._ends.
      super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
      ._M_impl.super__Vector_impl_data._M_finish != peVar2) {
    __assert_fail("_nranges == _ends.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/iterator.hh"
                  ,0x1e9,
                  "void tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>>::clear() [R = tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>]"
                 );
  }
  if ((this->_cartesian_it)._its.
      super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
      ._M_impl.super__Vector_impl_data._M_finish != peVar3) {
    __assert_fail("_nranges == _its.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/iterator.hh"
                  ,0x1ea,
                  "void tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>>::clear() [R = tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>]"
                 );
  }
  psVar7 = (this->_sync_it)._M_current;
  while (psVar7 != (this->_sync_end)._M_current) {
    pmVar4 = (this->_vloc)._t;
    if (pmVar4 == (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) goto LAB_001abc4d;
    psVar8 = (psVar7->_constraints).
             super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar5 = (psVar7->_constraints).
             super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar9 = psVar8 == psVar5;
    if (!bVar9) {
      this_00 = (this->_loc_edges_maps).
                super___shared_ptr<const_tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      bVar9 = false;
      do {
        if (psVar8->_strength == SYNC_STRONG) {
          if ((pmVar4->super_vloc_t).super_loc_array_t.super_vloc_base_t.
              super_array_capacity_t<unsigned_int>._capacity <= psVar8->_pid) goto LAB_001abc2e;
          bVar6 = tchecker::system::loc_edges_maps_t::event
                            (this_00,(loc_id_t)
                                     (&(pmVar4->super_vloc_t).super_loc_array_t._fam)[psVar8->_pid],
                             psVar8->_event_id);
          if (!bVar6) break;
        }
        psVar8 = psVar8 + 1;
        bVar9 = psVar8 == psVar5;
      } while (!bVar9);
    }
    if (bVar9) break;
    psVar7 = (this->_sync_it)._M_current + 1;
    (this->_sync_it)._M_current = psVar7;
  }
  psVar7 = (this->_sync_it)._M_current;
  if (psVar7 != (this->_sync_end)._M_current) {
    psVar8 = (psVar7->_constraints).
             super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar5 = (psVar7->_constraints).
             super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar8 != psVar5) {
      do {
        pmVar4 = (this->_vloc)._t;
        if (pmVar4 == (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) {
LAB_001abc4d:
          __assert_fail("_t != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                        ,0x1d0,
                        "T &tchecker::intrusive_shared_ptr_t<const tchecker::make_shared_t<tchecker::vloc_t>>::operator*() const [T = const tchecker::make_shared_t<tchecker::vloc_t>]"
                       );
        }
        if ((pmVar4->super_vloc_t).super_loc_array_t.super_vloc_base_t.
            super_array_capacity_t<unsigned_int>._capacity <= psVar8->_pid) {
LAB_001abc2e:
          __assert_fail("i < BASE::_capacity",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/array.hh"
                        ,0xfd,
                        "const T &tchecker::make_array_t<unsigned int, 4, tchecker::vloc_base_t>::operator[](typename BASE::capacity_t) const [T = unsigned int, T_ALLOCSIZE = 4, BASE = tchecker::vloc_base_t]"
                       );
        }
        local_40 = tchecker::system::loc_edges_maps_t::edges
                             ((this->_loc_edges_maps).
                              super___shared_ptr<const_tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,(loc_id_t)
                                      (&(pmVar4->super_vloc_t).super_loc_array_t._fam)[psVar8->_pid]
                              ,psVar8->_event_id);
        if ((psVar8->_strength != SYNC_WEAK) ||
           ((shared_ptr<tchecker::system::edge_t> *)local_40._begin.super_const_iterator._M_current
            != local_40._end.super_const_iterator._M_current.super_const_iterator)) {
          cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
          ::push_back(&this->_cartesian_it,&local_40);
        }
        psVar8 = psVar8 + 1;
      } while (psVar8 != psVar5);
    }
  }
  return;
}

Assistant:

void tchecker::syncprod::vloc_synchronized_edges_iterator_t::advance_while_empty_cartesian_product()
{
  _cartesian_it.clear();

  while (!at_end()) {
    if (tchecker::syncprod::enabled(*_sync_it, *_vloc, *_loc_edges_maps))
      break;
    ++_sync_it;
  }

  if (at_end())
    return;

  auto constraints = _sync_it->synchronization_constraints();
  for (auto const & constr : constraints) {
    auto edges = _loc_edges_maps->edges((*_vloc)[constr.pid()], constr.event_id());
    if ((constr.strength() == tchecker::SYNC_WEAK) && (edges.begin() == edges.end()))
      continue;
    _cartesian_it.push_back(edges);
  }
}